

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O3

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::GenFBBValueCast_abi_cxx11_
          (string *__return_storage_ptr__,KotlinGenerator *this,FieldDef *field)

{
  BaseType BVar1;
  Type type;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined2 uVar4;
  undefined6 uVar5;
  undefined8 unaff_RBX;
  
  BVar1 = (field->value).type.base_type;
  if ((BVar1 < BASE_TYPE_FLOAT) &&
     ((0x552U >> (BVar1 & (BASE_TYPE_UNION|BASE_TYPE_STRUCT)) & 1) != 0)) {
    uVar2 = (field->value).type.struct_def;
    uVar3 = (field->value).type.enum_def;
    uVar4 = (field->value).type.fixed_length;
    uVar5 = *(undefined6 *)&(field->value).type.field_0x1a;
    type.enum_def._2_6_ = uVar5;
    type.enum_def._0_2_ = uVar4;
    type.struct_def = (StructDef *)uVar3;
    type._0_8_ = uVar2;
    type._24_8_ = unaff_RBX;
    CastToSigned_abi_cxx11_(type);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenFBBValueCast(const FieldDef &field) const {
    if (IsUnsigned(field.value.type.base_type)) {
      return CastToSigned(field.value.type);
    }
    return "";
  }